

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O2

int run_negation_range_tests
              (int k,int h,int start_offset,int r_start,int r_end,int expected_type,_Bool inplace,
              _Bool expected_actual_inplace)

{
  byte bVar1;
  _Bool _Var2;
  bool bVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  run_container_t *src;
  int iVar5;
  uint8_t typecode;
  int iVar6;
  int iVar7;
  long lVar8;
  int x;
  uint uVar9;
  ulong uVar10;
  container_t *BO;
  run_container_t *prStack_10048;
  int iStack_10040;
  uint uStack_1003c;
  byte abStack_10038 [65544];
  
  iVar6 = 0;
  iStack_10040 = expected_type;
  uStack_1003c = r_end;
  src = run_container_create_given_capacity((int)(0x10000 / (ulong)(uint)k) + 1);
  _assert_true((ulong)(h < k),"h < k",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x62d);
  iVar7 = h;
  for (iVar5 = -start_offset; iVar5 != -0x10000; iVar5 = iVar5 + -1) {
    if (iVar6 % k == 0) {
      iVar4 = iVar7;
      if (0x10000 < start_offset + iVar7) {
        iVar4 = iVar5;
      }
      src->runs[src->n_runs] = (rle16_t)(iVar4 * 0x10000 + (start_offset & 0xffffU) + -0x10000);
      src->n_runs = src->n_runs + 1;
      iVar7 = iVar7 + 1;
      if (iVar7 == k) {
        iVar7 = h;
      }
    }
    iVar6 = iVar6 + 1;
    start_offset = start_offset + 1;
  }
  uVar9 = 0;
  for (lVar8 = 0; lVar8 != 0x10000; lVar8 = lVar8 + 1) {
    _Var2 = run_container_contains(src,(uint16_t)lVar8);
    bVar3 = _Var2 != r_start <= lVar8;
    uVar9 = uVar9 + bVar3;
    abStack_10038[lVar8] = bVar3;
  }
  if ((char)iStack_10040 == '\0') {
    iVar7 = run_container_negation_range(src,r_start,0x10000,&prStack_10048);
  }
  else {
    iVar7 = run_container_negation_range_inplace(src,r_start,0x10000,&prStack_10048);
  }
  typecode = (uint8_t)iVar7;
  iVar5 = container_get_cardinality(prStack_10048,typecode);
  _assert_int_equal((ulong)uStack_1003c,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x653);
  _assert_true((ulong)((prStack_10048 != src) != inplace),"BO == RI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,(uint)!inplace * 2 + 0x656);
  _assert_int_equal((ulong)uVar9,(long)iVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x65b);
  for (uVar10 = 0; uVar10 != 0x10000; uVar10 = uVar10 + 1) {
    _Var2 = container_contains(prStack_10048,(uint16_t)uVar10,typecode);
    bVar1 = abStack_10038[uVar10];
    if ((_Bool)bVar1 != _Var2) {
      printf("problem at index %d should be (but isnt) %d\n",uVar10 & 0xffffffff,(ulong)(uint)bVar1)
      ;
    }
    _Var2 = container_contains(prStack_10048,(uint16_t)uVar10,typecode);
    _assert_int_equal((ulong)_Var2,(ulong)(uint)bVar1,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                      ,0x665);
  }
  container_free(prStack_10048,typecode);
  iVar7 = extraout_EAX;
  if ((char)iStack_10040 == '\0') {
    run_container_free(src);
    iVar7 = extraout_EAX_00;
  }
  return iVar7;
}

Assistant:

static int run_negation_range_tests(int k, int h, int start_offset, int r_start,
                                    int r_end, int expected_type, bool inplace,
                                    bool expected_actual_inplace) {
    run_container_t* RI =
        run_container_create_given_capacity((1 << 16) / k + 1);
    container_t* BO;
    int returned_type;
    int result_size_should_be;
    bool result_should_be[1 << 16];

    assert_true(h <
                k);  // bad test call otherwise..not failure of code under test

    int runlen = h;
    for (int x = 0; x < (1 << 16) - start_offset; x++) {
        int offsetx = x + start_offset;
        if (x % k == 0) {
            int actual_runlen = runlen;
            if (offsetx + runlen > (1 << 16))
                actual_runlen = (1 << 16) - offsetx;

            // run_container_append does not dynamically increase its
            // array
            run_container_append_first(
                RI, CROARING_MAKE_RLE16(offsetx, actual_runlen - 1));
            if (++runlen == k) runlen = h;  // wrap after k-1 back to h.
        }
    }

    result_size_should_be = 0;

    for (int i = 0; i < (1 << 16); ++i) {
        bool in_zone = (i >= r_start && i < r_end);
        if (run_container_contains(RI, (uint16_t)i) ^ in_zone) {
            result_should_be[i] = true;
            ++result_size_should_be;
        } else
            result_should_be[i] = false;
    }
    if (inplace)
        returned_type =
            run_container_negation_range_inplace(RI, r_start, r_end, &BO);
    else
        returned_type = run_container_negation_range(RI, r_start, r_end, &BO);

    uint8_t result_typecode = (uint8_t)returned_type;

    int result_card = container_get_cardinality(BO, result_typecode);

    assert_int_equal(expected_type, returned_type);

    if (expected_actual_inplace) {
        assert_true(BO == RI);  // it really is inplace
    } else {
        assert_false(BO == RI);  // it better not be inplace
    }

    assert_int_equal(result_size_should_be, result_card);

    for (int x = 0; x < (1 << 16); x++) {
#ifndef UNVERBOSE_MIXED_CONTAINER
        if (container_contains(BO, (uint16_t)x, result_typecode) !=
            result_should_be[x])
            printf("problem at index %d should be (but isnt) %d\n", x,
                   (int)result_should_be[x]);
#endif
        assert_int_equal(container_contains(BO, (uint16_t)x, result_typecode),
                         result_should_be[x]);
    }
    // assert_int_equal(result_size_should_be, result_card);
    container_free(BO, result_typecode);
    if (!inplace) run_container_free(RI);
    // for inplace: input is either output, or it was already freed
    // internally

    return 1;
}